

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

runtime_type<> * __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::consume_operation::complete_type(consume_operation *this)

{
  bool bVar1;
  uintptr_t uint_pointer;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::default_busy_wait>_>
          ::Consume::empty((Consume *)this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
               ,0x462);
  }
  return (runtime_type<> *)(*(long *)(this + 8) + 8);
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *Base::type_after_control(m_consume_data.m_control);
            }